

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetNextWindowPos(ImVec2 *pos,ImGuiCond cond,ImVec2 *pivot)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if ((cond & cond - 1U) == 0) {
    (GImGui->NextWindowData).PosVal = *pos;
    (pIVar1->NextWindowData).PosPivotVal = *pivot;
    (pIVar1->NextWindowData).PosCond = cond + (uint)(cond == 0);
    return;
  }
  __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                ,0x1bed,"void ImGui::SetNextWindowPos(const ImVec2 &, ImGuiCond, const ImVec2 &)");
}

Assistant:

void ImGui::SetNextWindowPos(const ImVec2& pos, ImGuiCond cond, const ImVec2& pivot)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    g.NextWindowData.PosVal = pos;
    g.NextWindowData.PosPivotVal = pivot;
    g.NextWindowData.PosCond = cond ? cond : ImGuiCond_Always;
}